

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O2

void fy_parse_eventp_list_recycle_all(fy_parser *fyp,fy_eventp_list *_l)

{
  fy_eventp *fyep;
  
  while( true ) {
    fyep = fy_eventp_list_pop(_l);
    if (fyep == (fy_eventp *)0x0) break;
    fy_parse_eventp_recycle(fyp,fyep);
  }
  return;
}

Assistant:

struct fy_eventp *fy_parse_eventp_alloc(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    fyep = fy_parse_eventp_alloc_simple(fyp);
    if (!fyep)
        return NULL;
    fyep->fyp = fyp;
    fyep->e.type = FYET_NONE;

    return fyep;
}